

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O0

void reportInfo(FILE *file,vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,
               HighsFileType file_type)

{
  size_type sVar1;
  const_reference ppIVar2;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_RSI;
  HighsInfoType type;
  HighsInt index;
  HighsInt num_info;
  HighsFileType in_stack_00000084;
  InfoRecordDouble *in_stack_00000088;
  FILE *in_stack_00000090;
  int local_1c;
  
  sVar1 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::size(in_RSI);
  for (local_1c = 0; local_1c < (int)sVar1; local_1c = local_1c + 1) {
    ppIVar2 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                        (in_RSI,(long)local_1c);
    if ((*ppIVar2)->type == kInt64) {
      std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[](in_RSI,(long)local_1c);
      reportInfo(in_stack_00000090,(InfoRecordInt64 *)in_stack_00000088,in_stack_00000084);
    }
    else if ((*ppIVar2)->type == kInt) {
      std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[](in_RSI,(long)local_1c);
      reportInfo(in_stack_00000090,(InfoRecordInt *)in_stack_00000088,in_stack_00000084);
    }
    else {
      std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[](in_RSI,(long)local_1c);
      reportInfo(in_stack_00000090,in_stack_00000088,in_stack_00000084);
    }
  }
  return;
}

Assistant:

void reportInfo(FILE* file, const std::vector<InfoRecord*>& info_records,
                const HighsFileType file_type) {
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    HighsInfoType type = info_records[index]->type;
    if (type == HighsInfoType::kInt64) {
      reportInfo(file, ((InfoRecordInt64*)info_records[index])[0], file_type);
    } else if (type == HighsInfoType::kInt) {
      reportInfo(file, ((InfoRecordInt*)info_records[index])[0], file_type);
    } else {
      reportInfo(file, ((InfoRecordDouble*)info_records[index])[0], file_type);
    }
  }
}